

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_loadk64(ASMState *as,Reg r,IRIns *ir)

{
  uint uVar1;
  x86Op xVar2;
  bool bVar3;
  
  uVar1 = 0xffff0000 >> ((byte)r & 0x1f);
  if (ir[1] != (IRIns)0x0) {
    bVar3 = (uVar1 & 1) != 0;
    uVar1 = r | 0x80200;
    if (bVar3) {
      uVar1 = r;
    }
    xVar2 = XO_MOVSD;
    if (!bVar3) {
      xVar2 = XO_MOV;
    }
    emit_rma(as,xVar2,uVar1,ir + 1);
    return;
  }
  xVar2 = XO_XORPS;
  if ((uVar1 & 1) == 0) {
    xVar2 = 0x330000fe;
  }
  emit_rr(as,xVar2,r,r);
  return;
}

Assistant:

static void emit_loadk64(ASMState *as, Reg r, IRIns *ir)
{
  Reg r64;
  x86Op xo;
  const uint64_t *k = &ir_k64(ir)->u64;
  if (rset_test(RSET_FPR, r)) {
    r64 = r;
    xo = XO_MOVSD;
  } else {
    r64 = r | REX_64;
    xo = XO_MOV;
  }
  if (*k == 0) {
    emit_rr(as, rset_test(RSET_FPR, r) ? XO_XORPS : XO_ARITH(XOg_XOR), r, r);
#if LJ_GC64
  } else if (checki32((intptr_t)k) || checki32(dispofs(as, k)) ||
	     (checki32(mcpofs(as, k)) && checki32(mctopofs(as, k)))) {
    emit_rma(as, xo, r64, k);
  } else {
    if (ir->i) {
      lj_assertA(*k == *(uint64_t*)(as->mctop - ir->i),
		 "bad interned 64 bit constant");
    } else if (as->curins <= as->stopins && rset_test(RSET_GPR, r)) {
      emit_loadu64(as, r, *k);
      return;
    } else {
      /* If all else fails, add the FP constant at the MCode area bottom. */
      while ((uintptr_t)as->mcbot & 7) *as->mcbot++ = XI_INT3;
      *(uint64_t *)as->mcbot = *k;
      ir->i = (int32_t)(as->mctop - as->mcbot);
      as->mcbot += 8;
      as->mclim = as->mcbot + MCLIM_REDZONE;
      lj_mcode_commitbot(as->J, as->mcbot);
    }
    emit_rmro(as, xo, r64, RID_RIP, (int32_t)mcpofs(as, as->mctop - ir->i));
#else
  } else {
    emit_rma(as, xo, r64, k);
#endif
  }